

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_qr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  REF_DBL RVar13;
  double dVar14;
  double dVar15;
  ulong local_58;
  REF_DBL *local_50;
  
  uVar12 = (ulong)(uint)m;
  uVar11 = (ulong)(uint)n;
  if (0 < n) {
    uVar8 = 0;
    pRVar5 = q;
    pRVar4 = a;
    do {
      if (0 < m) {
        uVar9 = 0;
        do {
          pRVar5[uVar9] = pRVar4[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
      }
      uVar8 = uVar8 + 1;
      pRVar5 = pRVar5 + uVar12;
      pRVar4 = pRVar4 + uVar12;
    } while (uVar8 != uVar11);
  }
  if (0 < n) {
    uVar9 = 0;
    uVar8 = uVar11;
    do {
      memset(r + uVar9,0,uVar11 * 8);
      uVar9 = (ulong)(uint)((int)uVar9 + n);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (0 < n) {
    pRVar5 = a + uVar12;
    local_50 = q + uVar12;
    local_58 = 1;
    uVar9 = 0;
    uVar8 = 0;
    do {
      if (0 < m) {
        iVar2 = (n + 1) * (int)uVar8;
        RVar13 = r[iVar2];
        uVar3 = 0;
        do {
          RVar13 = RVar13 + q[uVar9 + uVar3] * q[uVar9 + uVar3];
          r[iVar2] = RVar13;
          uVar3 = uVar3 + 1;
        } while (uVar12 != uVar3);
      }
      iVar2 = (n + 1) * (int)uVar8;
      dVar14 = r[iVar2];
      if (dVar14 < 0.0) {
        RVar13 = sqrt(dVar14);
      }
      else {
        RVar13 = SQRT(dVar14);
      }
      r[iVar2] = RVar13;
      if (0 < m) {
        uVar3 = 0;
        do {
          dVar14 = r[iVar2] * 1e+20;
          if (dVar14 <= -dVar14) {
            dVar14 = -dVar14;
          }
          dVar1 = q[uVar9 + uVar3];
          dVar15 = dVar1;
          if (dVar1 <= -dVar1) {
            dVar15 = -dVar1;
          }
          if (dVar14 <= dVar15) {
            return 4;
          }
          q[uVar9 + uVar3] = dVar1 / r[iVar2];
          uVar3 = uVar3 + 1;
        } while (uVar12 != uVar3);
      }
      uVar3 = uVar8 + 1;
      pRVar4 = local_50;
      pRVar6 = pRVar5;
      uVar7 = local_58;
      if (uVar3 < uVar11) {
        do {
          if (0 < m) {
            RVar13 = r[uVar8 + uVar7 * uVar11];
            uVar10 = 0;
            do {
              RVar13 = RVar13 + pRVar6[uVar10] * q[uVar9 + uVar10];
              r[uVar8 + uVar7 * uVar11] = RVar13;
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          if (0 < m) {
            uVar10 = 0;
            do {
              pRVar4[uVar10] = pRVar4[uVar10] - r[uVar8 + uVar7 * uVar11] * q[uVar9 + uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          uVar7 = uVar7 + 1;
          pRVar4 = pRVar4 + uVar12;
          pRVar6 = pRVar6 + uVar12;
        } while (uVar7 != uVar11);
      }
      local_58 = local_58 + 1;
      uVar9 = (ulong)(uint)((int)uVar9 + m);
      pRVar5 = pRVar5 + uVar12;
      local_50 = local_50 + uVar12;
      uVar8 = uVar3;
    } while (uVar3 != uVar11);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_qr(REF_INT m, REF_INT n, REF_DBL *a, REF_DBL *q,
                                 REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < m; i++) q[i + m * j] = a[i + m * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) r[i + n * j] = 0.0;

  for (k = 0; k < n; k++) {
    for (i = 0; i < m; i++) r[k + n * k] += q[i + m * k] * q[i + m * k];
    r[k + n * k] = sqrt(r[k + n * k]);
    for (i = 0; i < m; i++) {
      if (!ref_math_divisible(q[i + m * k], r[k + n * k])) {
        return REF_DIV_ZERO;
      }
      q[i + m * k] /= r[k + n * k];
    }
    for (j = k + 1; j < n; j++) {
      for (i = 0; i < m; i++) r[k + n * j] += a[i + m * j] * q[i + m * k];
      for (i = 0; i < m; i++) q[i + m * j] -= r[k + n * j] * q[i + m * k];
    }
  }

  return REF_SUCCESS;
}